

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.cpp
# Opt level: O3

void __thiscall channel::~channel(channel *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  LogMessage *pLVar4;
  Log local_50;
  
  this->_vptr_channel = (_func_int **)&PTR__channel_00116b20;
  close(this->fd);
  Log::Log(&local_50,0x2c,
           "/workspace/llm4binary/github/license_all_cmakelists_25/MR-Wuhaha[P]WebServer/channel.cpp"
          );
  pLVar4 = Log::PutMessage(&local_50);
  LogMessage::Append(pLVar4,"client fd: ",0xb);
  pLVar4 = LogMessage::operator<<(pLVar4,this->fd);
  LogMessage::Append(pLVar4," has been closed",0x10);
  Log::~Log(&local_50);
  if (this->read_buff != (char *)0x0) {
    operator_delete__(this->read_buff);
  }
  if (this->write_buff != (char *)0x0) {
    operator_delete__(this->write_buff);
  }
  p_Var2 = (this->wp_time_round_item).
           super___weak_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  p_Var2 = (this->super_enable_shared_from_this<channel>)._M_weak_this.
           super___weak_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

channel::~channel()
{
    close(fd);
    LOG <<"client fd: "<<fd<<" has been closed";
    delete[] read_buff;
    delete[] write_buff;
}